

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

void anon_unknown.dwarf_12a4996::TranslateMemoryDecoration
               (TQualifier *qualifier,
               vector<spv::Decoration,_std::allocator<spv::Decoration>_> *memory,
               bool useVulkanMemoryModel)

{
  undefined8 uVar1;
  undefined8 in_RAX;
  Decoration *pDVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  iterator iVar4;
  undefined8 uStack_18;
  
  uVar1 = in_RAX;
  if ((int)CONCAT71(in_register_00000011,useVulkanMemoryModel) != 0) goto LAB_0043e916;
  uStack_18._0_4_ = (undefined4)in_RAX;
  if ((*(ulong *)&qualifier->field_0x8 >> 0x32 & 1) == 0) {
    uVar1 = in_RAX;
    if ((*(ulong *)&qualifier->field_0x8 >> 0x31 & 1) == 0) goto LAB_0043e916;
    uStack_18 = CONCAT44(0x17,(undefined4)uStack_18);
    iVar4._M_current =
         (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current !=
        (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0043e908;
  }
  else {
    uStack_18 = CONCAT44(0x15,(undefined4)uStack_18);
    iVar4._M_current =
         (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pDVar2 = (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    if (iVar4._M_current == pDVar2) {
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::
      _M_realloc_insert<spv::Decoration>(memory,iVar4,(Decoration *)((long)&uStack_18 + 4));
      iVar4._M_current =
           (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pDVar2 = (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = DecorationVolatile;
      iVar4._M_current = iVar4._M_current + 1;
      (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    uStack_18 = CONCAT44(0x17,(undefined4)uStack_18);
    if (iVar4._M_current != pDVar2) {
LAB_0043e908:
      *iVar4._M_current = Coherent;
      (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      uVar1 = uStack_18;
      goto LAB_0043e916;
    }
  }
  std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::_M_realloc_insert<spv::Decoration>
            (memory,iVar4,(Decoration *)((long)&uStack_18 + 4));
  uVar1 = uStack_18;
LAB_0043e916:
  uStack_18 = uVar1;
  uVar3 = *(ulong *)&qualifier->field_0x8;
  if ((uVar3 >> 0x2e & 1) != 0) {
    uStack_18 = CONCAT44(0x13,(undefined4)uStack_18);
    iVar4._M_current =
         (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::
      _M_realloc_insert<spv::Decoration>(memory,iVar4,(Decoration *)((long)&uStack_18 + 4));
    }
    else {
      *iVar4._M_current = DecorationRestrict;
      (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    uVar3 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar3 >> 0x2f & 1) != 0) {
    uStack_18 = CONCAT44(0x18,(undefined4)uStack_18);
    iVar4._M_current =
         (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::
      _M_realloc_insert<spv::Decoration>(memory,iVar4,(Decoration *)((long)&uStack_18 + 4));
    }
    else {
      *iVar4._M_current = DecorationNonWritable;
      (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    uVar3 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar3 >> 0x30 & 1) != 0) {
    uStack_18 = CONCAT44(0x19,(undefined4)uStack_18);
    iVar4._M_current =
         (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::
      _M_realloc_insert<spv::Decoration>(memory,iVar4,(Decoration *)((long)&uStack_18 + 4));
    }
    else {
      *iVar4._M_current = DecorationNonReadable;
      (memory->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
  }
  return;
}

Assistant:

void TranslateMemoryDecoration(const glslang::TQualifier& qualifier, std::vector<spv::Decoration>& memory,
    bool useVulkanMemoryModel)
{
    if (!useVulkanMemoryModel) {
        if (qualifier.isVolatile()) {
            memory.push_back(spv::DecorationVolatile);
            memory.push_back(spv::DecorationCoherent);
        } else if (qualifier.isCoherent()) {
            memory.push_back(spv::DecorationCoherent);
        }
    }
    if (qualifier.isRestrict())
        memory.push_back(spv::DecorationRestrict);
    if (qualifier.isReadOnly())
        memory.push_back(spv::DecorationNonWritable);
    if (qualifier.isWriteOnly())
       memory.push_back(spv::DecorationNonReadable);
}